

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_punpcklbh_mips64(uint64_t fs,uint64_t ft)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)ft;
  uVar2 = (uint)fs;
  return fs & 0xff | (ulong)(uVar2 & 0xff000000) << 0x18 | (ulong)(uVar2 & 0xff0000) << 0x10 |
         (ulong)((uVar2 & 0xff00) << 8) | (ulong)(uVar1 & 0xff000000) << 0x20 |
         (ulong)(uVar1 & 0xff0000) << 0x18 | (ulong)((uVar1 & 0xff00) << 0x10) |
         (ulong)((uVar1 & 0xff) << 8);
}

Assistant:

uint64_t helper_punpcklbh(uint64_t fs, uint64_t ft)
{
    unsigned host = BYTE_ORDER_XOR(7);
    LMIValue vd, vs, vt;

    vs.d = fs;
    vt.d = ft;
    vd.ub[0 ^ host] = vs.ub[0 ^ host];
    vd.ub[1 ^ host] = vt.ub[0 ^ host];
    vd.ub[2 ^ host] = vs.ub[1 ^ host];
    vd.ub[3 ^ host] = vt.ub[1 ^ host];
    vd.ub[4 ^ host] = vs.ub[2 ^ host];
    vd.ub[5 ^ host] = vt.ub[2 ^ host];
    vd.ub[6 ^ host] = vs.ub[3 ^ host];
    vd.ub[7 ^ host] = vt.ub[3 ^ host];

    return vd.d;
}